

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutSopBalanceEvalIntInt
              (Vec_Int_t *vCover,int nLeaves,int *pTimes,Vec_Int_t *vAig,int fCompl,int *pArea)

{
  int iVar1;
  long lVar2;
  int iRes;
  int pFaninLits [15];
  uint local_6c;
  int local_68 [16];
  
  local_6c = 0;
  if (0 < nLeaves && vAig != (Vec_Int_t *)0x0) {
    lVar2 = 0;
    do {
      *(int *)((long)local_68 + lVar2 * 2) = (int)lVar2;
      lVar2 = lVar2 + 2;
    } while ((ulong)(uint)nLeaves * 2 != lVar2);
  }
  iVar1 = If_CutSopBalanceEvalInt(vCover,pTimes,local_68,vAig,(int *)&local_6c,nLeaves,pArea);
  if (iVar1 != -1 && vAig != (Vec_Int_t *)0x0) {
    if (((int)local_6c < 0) || (vAig->nSize < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (local_6c >> 1 != (((uint)vAig->nSize >> 1) + nLeaves) - 1) {
      __assert_fail("vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xf2,
                    "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                   );
    }
    if (vAig != (Vec_Int_t *)0x0) {
      if ((int)local_6c < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      Vec_IntPush(vAig,local_6c & 1 ^ fCompl);
      if ((vAig != (Vec_Int_t *)0x0) && ((vAig->nSize & 1) == 0)) {
        __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0xf5,
                      "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                     );
      }
    }
  }
  return iVar1;
}

Assistant:

int If_CutSopBalanceEvalIntInt( Vec_Int_t * vCover, int nLeaves, int * pTimes, Vec_Int_t * vAig, int fCompl, int * pArea ) 
{
    int pFaninLits[IF_MAX_FUNC_LUTSIZE];
    int iRes = 0, Res, k;
    if ( vAig )
        for ( k = 0; k < nLeaves; k++ )
            pFaninLits[k] = Abc_Var2Lit(k, 0);
    Res = If_CutSopBalanceEvalInt( vCover, pTimes, pFaninLits, vAig, &iRes, nLeaves, pArea );
    if ( Res == -1 )
        return -1;
    assert( vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iRes) ^ fCompl );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}